

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O1

void duckdb::PhysicalJoin::ConstructAntiJoinResult
               (DataChunk *left,DataChunk *result,bool *found_match)

{
  idx_t iVar1;
  idx_t count_p;
  idx_t iVar2;
  SelectionVector sel;
  SelectionVector local_30;
  
  SelectionVector::SelectionVector(&local_30,0x800);
  iVar1 = left->count;
  if (iVar1 == 0) {
    count_p = 0;
  }
  else {
    iVar2 = 0;
    count_p = 0;
    do {
      if (found_match[iVar2] == false) {
        local_30.sel_vector[count_p] = (sel_t)iVar2;
        count_p = count_p + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  if (count_p == 0) {
    result->count = 0;
  }
  else {
    DataChunk::Slice(result,left,&local_30,count_p,0);
  }
  if (local_30.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void PhysicalJoin::ConstructAntiJoinResult(DataChunk &left, DataChunk &result, bool found_match[]) {
	ConstructSemiOrAntiJoinResult<false>(left, result, found_match);
}